

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O3

ErrorGenerator *
cmCMakePresetsErrors::UNRECOGNIZED_CMAKE_VERSION
          (ErrorGenerator *__return_storage_ptr__,string *version,int current,int required)

{
  pointer pcVar1;
  string *psVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  int local_30;
  int iStack_2c;
  
  pcVar1 = (version->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + version->_M_string_length);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  local_30 = current;
  iStack_2c = required;
  psVar2 = (string *)operator_new(0x28);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar2,local_50,local_48 + (long)local_50);
  *(ulong *)(psVar2 + 0x20) = CONCAT44(iStack_2c,local_30);
  *(string **)&(__return_storage_ptr__->super__Function_base)._M_functor = psVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsErrors.cxx:238:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmCMakePresetsErrors.cxx:238:10)>
       ::_M_manager;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

JsonErrors::ErrorGenerator UNRECOGNIZED_CMAKE_VERSION(
  const std::string& version, int current, int required)
{
  return [version, current, required](const Json::Value* value,
                                      cmJSONState* state) -> void {
    state->AddErrorAtValue(cmStrCat("\"cmakeMinimumRequired\" ", version,
                                    " version ", required,
                                    " must be less than ", current),
                           value);
  };
}